

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>::emplaceValue<QEditorInfo>
          (Node<QPersistentModelIndex,_QEditorInfo> *this,QEditorInfo *args)

{
  long lVar1;
  QEditorInfo *in_RDI;
  long in_FS_OFFSET;
  QEditorInfo *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QEditorInfo::QEditorInfo(in_RDI,in_stack_ffffffffffffffb8);
  QEditorInfo::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QEditorInfo::~QEditorInfo((QEditorInfo *)0x82b53b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }